

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

void proto2_unittest::TestNestedChildExtension::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  ulong uVar2;
  void *pvVar3;
  Nonnull<const_char_*> pcVar4;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 3) != 0) {
      if ((uVar1 & 1) != 0) {
        from_msg_00 = (MessageLite *)from_msg[1]._internal_metadata_.ptr_;
        if (from_msg_00 == (MessageLite *)0x0) {
          MergeImpl((TestNestedChildExtension *)&stack0xffffffffffffffd0);
          goto LAB_00cb768f;
        }
        to_msg_00 = (MessageLite *)to_msg[1]._internal_metadata_.ptr_;
        if (to_msg_00 == (MessageLite *)0x0) {
          pvVar3 = google::protobuf::Arena::CopyConstruct<proto2_unittest::TestChildExtension>
                             (arena,from_msg_00);
          to_msg[1]._internal_metadata_.ptr_ = (intptr_t)pvVar3;
        }
        else {
          TestChildExtension::MergeImpl(to_msg_00,from_msg_00);
        }
      }
      if ((uVar1 & 2) != 0) {
        *(undefined4 *)&to_msg[2]._vptr_MessageLite = *(undefined4 *)&from_msg[2]._vptr_MessageLite;
      }
    }
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
    uVar2 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar2 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
    return;
  }
LAB_00cb768f:
  MergeImpl();
}

Assistant:

void TestNestedChildExtension::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestNestedChildExtension*>(&to_msg);
  auto& from = static_cast<const TestNestedChildExtension&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestNestedChildExtension)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.child_ != nullptr);
      if (_this->_impl_.child_ == nullptr) {
        _this->_impl_.child_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.child_);
      } else {
        _this->_impl_.child_->MergeFrom(*from._impl_.child_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.a_ = from._impl_.a_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}